

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O0

void VP8LAddGreenToBlueAndRed_C(uint32_t *src,int num_pixels,uint32_t *dst)

{
  uint uVar1;
  uint uVar2;
  uint32_t red_blue;
  uint32_t green;
  uint32_t argb;
  int i;
  uint32_t *dst_local;
  int num_pixels_local;
  uint32_t *src_local;
  
  for (i = 0; i < num_pixels; i = i + 1) {
    uVar1 = src[i];
    uVar2 = uVar1 >> 8 & 0xff;
    dst[i] = uVar1 & 0xff00ff00 | (uVar2 << 0x10 | uVar2) + (uVar1 & 0xff00ff) & 0xff00ff;
  }
  return;
}

Assistant:

void VP8LAddGreenToBlueAndRed_C(const uint32_t* src, int num_pixels,
                                uint32_t* dst) {
  int i;
  for (i = 0; i < num_pixels; ++i) {
    const uint32_t argb = src[i];
    const uint32_t green = ((argb >> 8) & 0xff);
    uint32_t red_blue = (argb & 0x00ff00ffu);
    red_blue += (green << 16) | green;
    red_blue &= 0x00ff00ffu;
    dst[i] = (argb & 0xff00ff00u) | red_blue;
  }
}